

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate.cpp
# Opt level: O0

void __thiscall
pbrt::CPUAggregate::IntersectOneRandom
          (CPUAggregate *this,int maxRays,SubsurfaceScatterQueue *subsurfaceScatterQueue)

{
  int iVar1;
  WorkQueue<pbrt::SubsurfaceScatterWorkItem> *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffd0;
  _Manager_type in_stack_ffffffffffffffd8;
  _Invoker_type in_stack_ffffffffffffffe0;
  
  iVar1 = WorkQueue<pbrt::SubsurfaceScatterWorkItem>::Size(in_stack_ffffffffffffff98);
  std::function<void(long)>::
  function<pbrt::CPUAggregate::IntersectOneRandom(int,pbrt::SubsurfaceScatterQueue*)const::__0,void>
            ((function<void_(long)> *)&stack0xffffffffffffffc8,
             (anon_class_16_2_881facf7 *)(long)iVar1);
  ParallelFor((int64_t)in_stack_ffffffffffffffe0,(int64_t)in_stack_ffffffffffffffd8,
              (function<void_(long)> *)in_stack_ffffffffffffffd0);
  std::function<void_(long)>::~function((function<void_(long)> *)0xa06cd7);
  return;
}

Assistant:

void CPUAggregate::IntersectOneRandom(
    int maxRays, SubsurfaceScatterQueue *subsurfaceScatterQueue) const {
    ParallelFor(0, subsurfaceScatterQueue->Size(), [=](int index) {
        const SubsurfaceScatterWorkItem &w = (*subsurfaceScatterQueue)[index];
        uint64_t seed = Hash(w.p0, w.p1);

        WeightedReservoirSampler<SubsurfaceInteraction> wrs(seed);
        Interaction base(w.p0, 0.f /* FIXME time */, Medium());
        while (true) {
            Ray r = base.SpawnRayTo(w.p1);
            if (r.d == Vector3f(0, 0, 0))
                break;
            pstd::optional<ShapeIntersection> si = aggregate.Intersect(r, 1);
            if (!si)
                break;
            base = si->intr;
            if (si->intr.material == w.material)
                wrs.Add(SubsurfaceInteraction(si->intr), 1.f);
        }

        if (wrs.HasSample()) {
            subsurfaceScatterQueue->reservoirPDF[index] = wrs.SampleProbability();
            subsurfaceScatterQueue->ssi[index] = wrs.GetSample();
        } else
            subsurfaceScatterQueue->reservoirPDF[index] = 0;
    });
}